

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O1

CTransactionRef __thiscall orphanage_tests::TxOrphanageTest::RandomOrphan(TxOrphanageTest *this)

{
  _Base_ptr p_Var1;
  undefined4 uVar2;
  iterator iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
  *in_RSI;
  long in_FS_OFFSET;
  Span<std::byte> output;
  CTransactionRef CVar4;
  uint256 ret;
  byte local_68 [8];
  uchar auStack_60 [24];
  key_type local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  auStack_60[8] = '\0';
  auStack_60[9] = '\0';
  auStack_60[10] = '\0';
  auStack_60[0xb] = '\0';
  auStack_60[0xc] = '\0';
  auStack_60[0xd] = '\0';
  auStack_60[0xe] = '\0';
  auStack_60[0xf] = '\0';
  auStack_60[0x10] = '\0';
  auStack_60[0x11] = '\0';
  auStack_60[0x12] = '\0';
  auStack_60[0x13] = '\0';
  auStack_60[0x14] = '\0';
  auStack_60[0x15] = '\0';
  auStack_60[0x16] = '\0';
  auStack_60[0x17] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  auStack_60[0] = '\0';
  auStack_60[1] = '\0';
  auStack_60[2] = '\0';
  auStack_60[3] = '\0';
  auStack_60[4] = '\0';
  auStack_60[5] = '\0';
  auStack_60[6] = '\0';
  auStack_60[7] = '\0';
  output.m_size = 0x20;
  output.m_data = local_68;
  FastRandomContext::fillrand
            ((FastRandomContext *)in_RSI[3]._M_impl.super__Rb_tree_header._M_header._M_right,output)
  ;
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = auStack_60[8];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = auStack_60[9];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = auStack_60[10];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = auStack_60[0xb];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = auStack_60[0xc];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = auStack_60[0xd];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = auStack_60[0xe];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = auStack_60[0xf];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = auStack_60[0x10];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = auStack_60[0x11];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = auStack_60[0x12];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = auStack_60[0x13];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = auStack_60[0x14];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = auStack_60[0x15];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = auStack_60[0x16];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = auStack_60[0x17];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_68[0];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_68[1];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_68[2];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_68[3];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_68[4];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_68[5];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_68[6];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_68[7];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = auStack_60[0];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = auStack_60[1];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = auStack_60[2];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = auStack_60[3];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = auStack_60[4];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = auStack_60[5];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = auStack_60[6];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = auStack_60[7];
  iVar3 = std::
          _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
          ::lower_bound(in_RSI,&local_48);
  if ((_Rb_tree_header *)iVar3._M_node == &(in_RSI->_M_impl).super__Rb_tree_header) {
    iVar3._M_node = (in_RSI->_M_impl).super__Rb_tree_header._M_header._M_left;
  }
  uVar2 = *(undefined4 *)&iVar3._M_node[2].field_0x4;
  *(_Rb_tree_color *)&(this->super_TxOrphanage).m_orphans._M_t._M_impl.field_0x0 =
       iVar3._M_node[2]._M_color;
  *(undefined4 *)&(this->super_TxOrphanage).m_orphans._M_t._M_impl.field_0x4 = uVar2;
  p_Var1 = iVar3._M_node[2]._M_parent;
  *(_Base_ptr *)&(this->super_TxOrphanage).m_orphans._M_t._M_impl.super__Rb_tree_header._M_header =
       p_Var1;
  if (p_Var1 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

CTransactionRef RandomOrphan()
    {
        std::map<Wtxid, OrphanTx>::iterator it;
        it = m_orphans.lower_bound(Wtxid::FromUint256(m_rng.rand256()));
        if (it == m_orphans.end())
            it = m_orphans.begin();
        return it->second.tx;
    }